

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O2

void __thiscall
ValueInfo::ValueInfo(ValueInfo *this,ValueType type,ValueStructureKind structureKind)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueType local_12 [4];
  ValueType type_local;
  
  (this->super_ValueType).field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)type.field_0;
  this->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_01371d98;
  this->structureKind = structureKind;
  this->symStore = (Sym *)0x0;
  bVar2 = ValueType::IsTaggedInt(local_12);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                       ,0x2d,"(!type.IsTaggedInt())","!type.IsTaggedInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

ValueInfo(const ValueType type, const ValueStructureKind structureKind)
        : ValueType(type), structureKind(structureKind), symStore(nullptr)
    {
        // We can only prove that the representation is a tagged int on a ToVar. Currently, we cannot have more than one value
        // info per value number in a block, so a value info specifying tagged int representation cannot be created for a
        // specific sym. Instead, a value info can be shared by multiple syms, and hence cannot specify tagged int
        // representation. Currently, the tagged int representation info can only be carried on the dst opnd of ToVar, and can't
        // even be propagated forward.
        Assert(!type.IsTaggedInt());
    }